

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::printUnaryPrefix(JSPrinter *this,Ref node)

{
  int iVar1;
  size_t sVar2;
  char cVar3;
  uint uVar4;
  Ref *pRVar5;
  undefined8 *puVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  Ref local_28;
  Ref node_local;
  
  local_28.inst = node.inst;
  if (this->finalize == true) {
    pRVar5 = (Ref *)cashew::Ref::operator[]((uint)&local_28);
    cVar3 = cashew::Ref::operator==(pRVar5,(IString *)&PLUS);
    if (cVar3 != '\0') {
      puVar6 = (undefined8 *)cashew::Ref::operator[]((uint)&local_28);
      if (*(int *)*puVar6 == 1) {
LAB_00179620:
        iVar1 = (int)this->used;
        puVar6 = (undefined8 *)cashew::Ref::operator[]((uint)&local_28);
        print(this,(Value *)*puVar6);
        ensure(this,1);
        pcVar9 = this->buffer;
        pcVar9[this->used] = '\0';
        pcVar9 = pcVar9 + iVar1;
        pcVar7 = strstr(pcVar9,"Infinity");
        if (pcVar7 != (char *)0x0) {
          return;
        }
        pcVar7 = strstr(pcVar9,"NaN");
        if (pcVar7 != (char *)0x0) {
          return;
        }
        pcVar7 = strchr(pcVar9,0x2e);
        if (pcVar7 != (char *)0x0) {
          return;
        }
        pcVar9 = strchr(pcVar9,0x65);
        if (pcVar9 != (char *)0x0) {
          ensure(this,3);
          pcVar7 = this->buffer;
          sVar8 = strlen(pcVar7 + iVar1);
          for (pcVar7 = pcVar7 + iVar1 + sVar8; pcVar9 <= pcVar7; pcVar7 = pcVar7 + -1) {
            pcVar7[2] = *pcVar7;
          }
          pcVar9[0] = '.';
          pcVar9[1] = '0';
          this->used = this->used + 2;
          return;
        }
        emit(this,".0");
        return;
      }
      puVar6 = (undefined8 *)cashew::Ref::operator[]((uint)&local_28);
      if (*(int *)*puVar6 == 2) {
        uVar4 = cashew::Ref::operator[]((uint)&local_28);
        pRVar5 = (Ref *)cashew::Ref::operator[](uVar4);
        cVar3 = cashew::Ref::operator==(pRVar5,(IString *)&UNARY_PREFIX);
        if (cVar3 != '\0') {
          uVar4 = cashew::Ref::operator[]((uint)&local_28);
          pRVar5 = (Ref *)cashew::Ref::operator[](uVar4);
          cVar3 = cashew::Ref::operator==(pRVar5,(IString *)&MINUS);
          if (cVar3 != '\0') {
            uVar4 = cashew::Ref::operator[]((uint)&local_28);
            puVar6 = (undefined8 *)cashew::Ref::operator[](uVar4);
            if (*(int *)*puVar6 == 1) goto LAB_00179620;
          }
        }
      }
    }
  }
  if (this->buffer[this->used - 1] == '-') {
    pRVar5 = (Ref *)cashew::Ref::operator[]((uint)&local_28);
    cVar3 = cashew::Ref::operator==(pRVar5,(IString *)&MINUS);
    if (cVar3 == '\0') goto LAB_001797b2;
  }
  else {
LAB_001797b2:
    if (this->buffer[this->used - 1] != '+') goto LAB_00179810;
    pRVar5 = (Ref *)cashew::Ref::operator[]((uint)&local_28);
    cVar3 = cashew::Ref::operator==(pRVar5,(IString *)&PLUS);
    if (cVar3 == '\0') goto LAB_00179810;
  }
  maybeSpace(this,' ');
  ensure(this,1);
  sVar2 = this->used;
  this->used = sVar2 + 1;
  this->buffer[sVar2] = ' ';
LAB_00179810:
  puVar6 = (undefined8 *)cashew::Ref::operator[]((uint)&local_28);
  if (*(int *)*puVar6 == 0) {
    emit(this,*(char **)((int *)*puVar6 + 4));
    puVar6 = (undefined8 *)cashew::Ref::operator[]((uint)&local_28);
    printChild(this,(Value *)*puVar6,local_28,1);
    return;
  }
  __assert_fail("isString()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0xec,"const char *cashew::Value::getCString()");
}

Assistant:

void printUnaryPrefix(Ref node) {
    if (finalize && node[1] == PLUS &&
        (node[2]->isNumber() ||
         (node[2]->isArray() && node[2][0] == UNARY_PREFIX &&
          node[2][1] == MINUS && node[2][2]->isNumber()))) {
      // emit a finalized number
      int last = used;
      print(node[2]);
      ensure(1);                  // we temporarily append a 0
      char* curr = buffer + last; // ensure might invalidate
      buffer[used] = 0;
      if (strstr(curr, "Infinity")) {
        return;
      }
      if (strstr(curr, "NaN")) {
        return;
      }
      if (strchr(curr, '.')) {
        return; // already a decimal point, all good
      }
      char* e = strchr(curr, 'e');
      if (!e) {
        emit(".0");
        return;
      }
      ensure(3);
      curr = buffer + last; // ensure might invalidate
      char* end = strchr(curr, 0);
      while (end >= e) {
        end[2] = end[0];
        end--;
      }
      e[0] = '.';
      e[1] = '0';
      used += 2;
      return;
    }
    if ((buffer[used - 1] == '-' && node[1] == MINUS) ||
        (buffer[used - 1] == '+' && node[1] == PLUS)) {
      emit(' '); // cannot join - and - to --, looks like the -- operator
    }
    emit(node[1]->getCString());
    printChild(node[2], node, 1);
  }